

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::LoadableGetStateBlock_x(ChElementHexaANCF_3813 *this)

{
  ChState *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_x
            ((ChElementHexaANCF_3813 *)
             ((this->super_ChElementHexahedron)._vptr_ChElementHexahedron[-6] + -0x80 +
             (long)&(this->m_StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>),in_ESI,in_RDX)
  ;
  return;
}

Assistant:

void ChElementHexaANCF_3813::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 9, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 12, 3) = m_nodes[4]->GetPos().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[5]->GetPos().eigen();
    mD.segment(block_offset + 18, 3) = m_nodes[6]->GetPos().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[7]->GetPos().eigen();
}